

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::BitState<unsigned_short>,short,duckdb::BitAndOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  ushort uVar1;
  unsigned_long *puVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  sel_t *psVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  ulong uVar11;
  idx_t iVar12;
  byte bVar13;
  ulong uVar14;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar7 = 0;
      uVar11 = 0;
      do {
        if (puVar2 == (unsigned_long *)0x0) {
          uVar8 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar8 = count;
          }
LAB_019bd39d:
          uVar9 = uVar11;
          if (uVar11 < uVar8) {
            bVar13 = *state;
            uVar6 = *(ushort *)(state + 2);
            do {
              uVar1 = *(ushort *)(pdVar3 + uVar11 * 2);
              if ((bVar13 & 1) == 0) {
                *state = '\x01';
                bVar13 = 1;
                uVar6 = uVar1;
              }
              else {
                uVar6 = uVar1 & uVar6;
              }
              uVar11 = uVar11 + 1;
            } while (uVar8 != uVar11);
            *(ushort *)(state + 2) = uVar6;
            uVar9 = uVar8;
          }
        }
        else {
          uVar4 = puVar2[uVar7];
          uVar8 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar8 = count;
          }
          if (uVar4 == 0xffffffffffffffff) goto LAB_019bd39d;
          uVar9 = uVar8;
          if ((uVar4 != 0) && (uVar9 = uVar11, uVar11 < uVar8)) {
            uVar14 = 0;
            do {
              if ((uVar4 >> (uVar14 & 0x3f) & 1) != 0) {
                uVar6 = *(ushort *)(pdVar3 + uVar14 * 2 + uVar11 * 2);
                if (*state == '\0') {
                  *(ushort *)(state + 2) = uVar6;
                  *state = '\x01';
                }
                else {
                  *(ushort *)(state + 2) = *(ushort *)(state + 2) & uVar6;
                }
              }
              uVar14 = uVar14 + 1;
              uVar9 = uVar8;
            } while (uVar8 - uVar11 != uVar14);
          }
        }
        uVar7 = uVar7 + 1;
        uVar11 = uVar9;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar2 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      uVar6 = *(ushort *)input->data;
      if (*state == '\0') {
        *state = '\x01';
      }
      else {
        uVar6 = uVar6 & *(ushort *)(state + 2);
      }
      *(ushort *)(state + 2) = uVar6;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_68.sel)->sel_vector;
        bVar13 = *state;
        uVar6 = *(ushort *)(state + 2);
        iVar10 = 0;
        do {
          iVar12 = iVar10;
          if (psVar5 != (sel_t *)0x0) {
            iVar12 = (idx_t)psVar5[iVar10];
          }
          uVar1 = *(ushort *)(local_68.data + iVar12 * 2);
          if ((bVar13 & 1) == 0) {
            *state = '\x01';
            bVar13 = 1;
            uVar6 = uVar1;
          }
          else {
            uVar6 = uVar1 & uVar6;
          }
          iVar10 = iVar10 + 1;
        } while (count != iVar10);
        *(ushort *)(state + 2) = uVar6;
      }
    }
    else if (count != 0) {
      psVar5 = (local_68.sel)->sel_vector;
      iVar10 = 0;
      do {
        iVar12 = iVar10;
        if (psVar5 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar5[iVar10];
        }
        if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar12 >> 6]
             >> (iVar12 & 0x3f) & 1) != 0) {
          if (*state == '\0') {
            *(ushort *)(state + 2) = *(ushort *)(local_68.data + iVar12 * 2);
            *state = '\x01';
          }
          else {
            *(ushort *)(state + 2) =
                 *(ushort *)(state + 2) & *(ushort *)(local_68.data + iVar12 * 2);
          }
        }
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}